

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O3

void stbir__fancy_alpha_unweight_2ch(float *encode_buffer,int width_times_channels)

{
  float *pfVar1;
  float fVar2;
  float *pfVar3;
  float *input;
  
  pfVar1 = encode_buffer + width_times_channels;
  pfVar3 = encode_buffer + 2;
  do {
    fVar2 = pfVar3[-1];
    *encode_buffer = pfVar3[-2];
    if (7.523164e-37 <= fVar2) {
      *encode_buffer = *pfVar3 / fVar2;
    }
    encode_buffer[1] = fVar2;
    encode_buffer = encode_buffer + 2;
    pfVar3 = pfVar3 + 3;
  } while (encode_buffer < pfVar1);
  return;
}

Assistant:

static void stbir__fancy_alpha_unweight_2ch( float * encode_buffer, int width_times_channels )
{
  float STBIR_SIMD_STREAMOUT_PTR(*) encode = encode_buffer;
  float STBIR_SIMD_STREAMOUT_PTR(*) input = encode_buffer;
  float const * end_output = encode_buffer + width_times_channels;

  do {
    float alpha = input[1];
    encode[0] = input[0];
    if ( alpha >= stbir__small_float )
      encode[0] = input[2] / alpha;
    encode[1] = alpha;

    input += 3;
    encode += 2;
  } while ( encode < end_output );
}